

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcDebugGetSourceLocationLineAndColumn(char *sourceLocation,uint moduleIndex,uint *column)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  
  lVar1 = *(long *)(NULLC::linker + 0x280);
  if (moduleIndex < *(uint *)(NULLC::linker + 0x28c)) {
    uVar3 = *(uint *)(lVar1 + 0x14 + (ulong)moduleIndex * 0x1c);
  }
  else {
    lVar2 = (ulong)(*(uint *)(NULLC::linker + 0x28c) - 1) * 0x1c;
    uVar3 = *(int *)(lVar1 + 0x18 + lVar2) + *(int *)(lVar1 + 0x14 + lVar2);
  }
  pcVar4 = (char *)(*(long *)(NULLC::linker + 0x2a0) + (ulong)uVar3);
  uVar3 = 0;
  pcVar5 = pcVar4;
  if (pcVar4 < sourceLocation) {
    uVar3 = 0;
    do {
      if (*pcVar5 == '\n') {
        pcVar4 = pcVar5 + 1;
LAB_0010fcd4:
        uVar3 = uVar3 + 1;
        pcVar5 = pcVar4;
      }
      else {
        if (*pcVar5 == '\r') {
          if (pcVar5[1] == '\n') {
            pcVar4 = pcVar5 + 2;
          }
          else {
            pcVar4 = pcVar5 + 1;
          }
          goto LAB_0010fcd4;
        }
        pcVar5 = pcVar5 + 1;
      }
    } while (pcVar5 < sourceLocation);
  }
  *column = (int)pcVar5 - (int)pcVar4;
  return uVar3;
}

Assistant:

unsigned nullcDebugGetSourceLocationLineAndColumn(const char *sourceLocation, unsigned moduleIndex, unsigned &column)
{
	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	const char *sourceStart = fullSource + (moduleIndex < moduleCount ? modules[moduleIndex].sourceOffset : modules[moduleCount - 1].sourceOffset + modules[moduleCount - 1].sourceSize);

	unsigned line = 0;

	const char *pos = sourceStart;
	const char *lastLineStart = pos;

	while(pos < sourceLocation)
	{
		if(*pos == '\r')
		{
			line++;

			pos++;

			if(*pos == '\n')
				pos++;

			lastLineStart = pos;
		}
		else if(*pos == '\n')
		{
			line++;

			pos++;

			lastLineStart = pos;
		}
		else
		{
			pos++;
		}
	}

	column = int(pos - lastLineStart);

	return line;
}